

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_unref(lua_State *L,int t,int ref)

{
  int iVar1;
  int local_1c;
  int ref_local;
  int t_local;
  lua_State *L_local;
  
  if (-1 < ref) {
    local_1c = t;
    if ((t < 1) && (-10000 < t)) {
      iVar1 = lua_gettop(L);
      local_1c = iVar1 + t + 1;
    }
    lua_rawgeti(L,local_1c,0);
    lua_rawseti(L,local_1c,ref);
    lua_pushinteger(L,(long)ref);
    lua_rawseti(L,local_1c,0);
  }
  return;
}

Assistant:

LUALIB_API void luaL_unref(lua_State *L, int t, int ref)
{
  if (ref >= 0) {
    t = abs_index(L, t);
    lua_rawgeti(L, t, FREELIST_REF);
    lua_rawseti(L, t, ref);  /* t[ref] = t[FREELIST_REF] */
    lua_pushinteger(L, ref);
    lua_rawseti(L, t, FREELIST_REF);  /* t[FREELIST_REF] = ref */
  }
}